

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vocabulary.cpp
# Opt level: O2

void __thiscall Vocabulary::Vocabulary(Vocabulary *this,string *file_path)

{
  int *piVar1;
  pointer pNVar2;
  pointer pNVar3;
  char cVar4;
  istream *piVar5;
  iterator iVar6;
  mapped_type *pmVar7;
  ostream *poVar8;
  string line;
  string token;
  Node local_3f8;
  fstream fs;
  stringstream ss;
  
  (this->node2Id)._M_h._M_buckets = &(this->node2Id)._M_h._M_single_bucket;
  (this->node2Id)._M_h._M_bucket_count = 1;
  (this->node2Id)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->node2Id)._M_h._M_element_count = 0;
  (this->node2Id)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->node2Id)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->node2Id)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::fstream::fstream(&fs,(string *)file_path,_S_in);
  cVar4 = std::__basic_file<char>::is_open();
  if (cVar4 == '\0') {
    poVar8 = std::operator<<((ostream *)&std::cout,"An error occurred during reading file.");
    std::endl<char,std::char_traits<char>>(poVar8);
  }
  else {
    line._M_dataplus._M_p = (pointer)&line.field_2;
    line._M_string_length = 0;
    line.field_2._M_local_buf[0] = '\0';
    token._M_dataplus._M_p = (pointer)&token.field_2;
    token._M_string_length = 0;
    token.field_2._M_local_buf[0] = '\0';
    this->total_nodes = 0;
    while( true ) {
      piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&fs,(string *)&line);
      if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&line,_S_out|_S_in);
      while( true ) {
        piVar5 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                           ((istream *)&ss,(string *)&token,' ');
        if (((byte)piVar5[*(long *)(*(long *)piVar5 + -0x18) + 0x20] & 5) != 0) break;
        iVar6 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::find((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                        *)this,&token);
        if (iVar6.
            super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_true>
            ._M_cur == (__node_type *)0x0) {
          pNVar2 = (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_start;
          pNVar3 = (this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                   super__Vector_impl_data._M_finish;
          pmVar7 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)this,&token);
          *pmVar7 = (mapped_type)(((long)pNVar3 - (long)pNVar2) / 0x30);
          Node::Node(&local_3f8,&token);
          std::vector<Node,_std::allocator<Node>_>::emplace_back<Node>
                    (&this->vocab_items,&local_3f8);
          std::__cxx11::string::~string((string *)&local_3f8);
        }
        pmVar7 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)this,&token);
        piVar1 = &(this->vocab_items).super__Vector_base<Node,_std::allocator<Node>_>._M_impl.
                  super__Vector_impl_data._M_start[*pmVar7].count;
        *piVar1 = *piVar1 + 1;
        this->total_nodes = this->total_nodes + 1;
      }
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
    }
    std::fstream::close();
    std::__cxx11::string::~string((string *)&token);
    std::__cxx11::string::~string((string *)&line);
  }
  poVar8 = std::operator<<((ostream *)&std::cout,"--> The input file has been successfully read!");
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"    + The total number of nodes: ");
  poVar8 = (ostream *)std::ostream::operator<<(poVar8,this->total_nodes);
  std::endl<char,std::char_traits<char>>(poVar8);
  poVar8 = std::operator<<((ostream *)&std::cout,"    + The total number of distinct nodes: ");
  poVar8 = std::ostream::_M_insert<unsigned_long>((ulong)poVar8);
  std::endl<char,std::char_traits<char>>(poVar8);
  std::fstream::~fstream(&fs);
  return;
}

Assistant:

Vocabulary::Vocabulary(string file_path) {

    fstream fs(file_path, fstream::in);
    if(fs.is_open()) {

        string line, token;

        total_nodes = 0;
        while( getline(fs, line) ) {
            stringstream ss(line);
            while( getline(ss, token, ' ') ) {

                // if the node was not added before
                auto token_search = node2Id.find(token);
                if (token_search == node2Id.end()) {

                    node2Id[token] = (int)vocab_items.size();
                    vocab_items.push_back(Node(token));
                }

                vocab_items[node2Id[token]].count++;
                total_nodes++;

            }

        }
        fs.close();

    } else {
        cout << "An error occurred during reading file." << endl;
    }

    cout << "--> The input file has been successfully read!" << endl;
    cout << "    + The total number of nodes: " << total_nodes << endl;
    cout << "    + The total number of distinct nodes: " << vocab_items.size() << endl;
}